

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ed25519_asn1.cc
# Opt level: O0

int ed25519_set_pub_raw(EVP_PKEY *pkey,uint8_t *in,size_t len)

{
  void *pvVar1;
  ED25519_KEY *key;
  size_t len_local;
  uint8_t *in_local;
  EVP_PKEY *pkey_local;
  
  if (len == 0x20) {
    pvVar1 = OPENSSL_malloc(0x41);
    if (pvVar1 == (void *)0x0) {
      pkey_local._4_4_ = 0;
    }
    else {
      OPENSSL_memcpy((void *)((long)pvVar1 + 0x20),in,0x20);
      *(undefined1 *)((long)pvVar1 + 0x40) = 0;
      ed25519_free(pkey);
      pkey->pkey = pvVar1;
      pkey_local._4_4_ = 1;
    }
  }
  else {
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ed25519_asn1.cc"
                  ,0x38);
    pkey_local._4_4_ = 0;
  }
  return pkey_local._4_4_;
}

Assistant:

static int ed25519_set_pub_raw(EVP_PKEY *pkey, const uint8_t *in, size_t len) {
  if (len != 32) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  ED25519_KEY *key =
      reinterpret_cast<ED25519_KEY *>(OPENSSL_malloc(sizeof(ED25519_KEY)));
  if (key == NULL) {
    return 0;
  }

  OPENSSL_memcpy(key->key + ED25519_PUBLIC_KEY_OFFSET, in, 32);
  key->has_private = 0;

  ed25519_free(pkey);
  pkey->pkey = key;
  return 1;
}